

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timer.cpp
# Opt level: O3

__pid_t __thiscall hwnet::util::TimerRoutine::wait(TimerRoutine *this,void *__stat_loc)

{
  mutex *__mutex;
  Timer *pTVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  void *pvVar3;
  int iVar4;
  duration in_RAX;
  long lVar5;
  milliseconds mVar6;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<unsigned_long,_std::ratio<1L,_1000000000L>_>_>
  local_38;
  
  __mutex = &(this->mgr).mtx;
  local_38.__d.__r = (duration)(duration)in_RAX.__r;
  iVar4 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar4 == 0) {
    if ((this->mgr).elements_size == 0) {
      this->waitting = true;
      this->waitTime = 0xffffffff;
      lVar5 = std::chrono::_V2::steady_clock::now();
      local_38.__d.__r = (duration)(lVar5 + 0xf423ffff0bdc0);
      std::_V2::condition_variable_any::
      wait_until<std::mutex,std::chrono::_V2::steady_clock,std::chrono::duration<unsigned_long,std::ratio<1l,1000000000l>>>
                (&this->cv,__mutex,&local_38);
    }
    else {
      pTVar1 = *(this->mgr).elements.
                super__Vector_base<hwnet::util::Timer_*,_std::allocator<hwnet::util::Timer_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      peVar2 = (pTVar1->selfPtr).super___shared_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      this_00 = (pTVar1->selfPtr).super___shared_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_00->_M_use_count = this_00->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_00->_M_use_count = this_00->_M_use_count + 1;
        }
      }
      pvVar3 = (void *)peVar2->mExpiredTime;
      mVar6 = (long)pvVar3 - (long)__stat_loc;
      if (__stat_loc <= pvVar3 && mVar6 != 0) {
        this->waitting = true;
        this->waitTime = mVar6;
        lVar5 = std::chrono::_V2::steady_clock::now();
        local_38.__d.__r = (duration)(mVar6 * 1000000 + lVar5);
        std::_V2::condition_variable_any::
        wait_until<std::mutex,std::chrono::_V2::steady_clock,std::chrono::duration<unsigned_long,std::ratio<1l,1000000000l>>>
                  (&this->cv,__mutex,&local_38);
      }
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
    }
    this->waitting = false;
    iVar4 = pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    return iVar4;
  }
  std::__throw_system_error(iVar4);
}

Assistant:

void TimerRoutine::wait(milliseconds now) {
	std::lock_guard<std::mutex> guard(this->mgr.mtx);
	if(this->mgr.elements_size == 0) {
		this->waitting = true;
		this->waitTime = 0xFFFFFFFF;
		this->cv.wait_for(this->mgr.mtx,this->waitTime * 1ms);
	} else {
		auto top = this->mgr.top();
		if(top->mExpiredTime > now) {
			this->waitting = true;
			this->waitTime = top->mExpiredTime - now;
			this->cv.wait_for(this->mgr.mtx,this->waitTime * 1ms);			
		}
	}
	this->waitting = false;
}